

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall
skiwi::anon_unknown_23::primitive_of_2_args_inlined::test(primitive_of_2_args_inlined *this)

{
  int in_R8D;
  int iVar1;
  allocator<char> local_8c9;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  compile_fixture::build_string_to_symbol(&this->super_compile_fixture);
  (this->super_compile_fixture).field_0x20 = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(+ 3 2)",&local_8c9);
  compile_fixture::run(&local_28,&this->super_compile_fixture,&local_8c8,true,in_R8D);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xae9,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(+ 3.2 2)",&local_8c9);
  compile_fixture::run(&local_48,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("5.2",&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaea,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(+ 3.2 2.3)",&local_8c9);
  compile_fixture::run(&local_68,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("5.5",&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaeb,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(+ 3 2.1)",&local_8c9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("5.1",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaec,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(- 3 2)",&local_8c9);
  compile_fixture::run(&local_a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaee,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(- 3.2 2)",&local_8c9);
  compile_fixture::run(&local_c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1.2",&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaef,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(- 3.2 2.3)",&local_8c9);
  compile_fixture::run(&local_e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0.9",&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf0,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(- 3 2.1)",&local_8c9);
  compile_fixture::run(&local_108,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0.9",&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf1,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(* 3 2)",&local_8c9);
  compile_fixture::run(&local_128,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("6",&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf3,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(* 3.2 2)",&local_8c9);
  compile_fixture::run(&local_148,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("6.4",&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf4,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(* 3.0 2.3)",&local_8c9);
  compile_fixture::run(&local_168,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("6.9",&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf5,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(* 3 2.1)",&local_8c9);
  compile_fixture::run(&local_188,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("6.3",&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf6,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 8 2)",&local_8c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf8,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 3.2 2)",&local_8c9);
  compile_fixture::run(&local_1c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1.6",&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf9,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 3.0 2.0)",&local_8c9);
  compile_fixture::run(&local_1e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_1e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafa,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 3 2.0)",&local_8c9);
  compile_fixture::run(&local_208,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafb,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(< 3 2.1)",&local_8c9);
  compile_fixture::run(&local_228,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafd,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(< 3.1 8)",&local_8c9);
  compile_fixture::run(&local_248,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafe,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(< 3.2 2.1)",&local_8c9);
  compile_fixture::run(&local_268,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaff,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(< 1 21)",&local_8c9);
  compile_fixture::run(&local_288,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb00,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 3 2.1)",&local_8c9);
  compile_fixture::run(&local_2a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb02,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 3.1 8)",&local_8c9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb03,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 3.2 2.1)",&local_8c9)
  ;
  compile_fixture::run(&local_2e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb04,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 1 21)",&local_8c9);
  compile_fixture::run(&local_308,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb05,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 2 2.0)",&local_8c9);
  compile_fixture::run(&local_328,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb06,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 3.0 3)",&local_8c9);
  compile_fixture::run(&local_348,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_348,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb07,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 3.2 3.2)",&local_8c9)
  ;
  compile_fixture::run(&local_368,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb08,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(<= 1 1)",&local_8c9);
  compile_fixture::run(&local_388,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_388,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb09,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(> 3 2.1)",&local_8c9);
  compile_fixture::run(&local_3a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(> 3.1 8)",&local_8c9);
  compile_fixture::run(&local_3c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_3c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(> 3.2 2.1)",&local_8c9);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0d,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(> 1 21)",&local_8c9);
  compile_fixture::run(&local_408,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_408,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 3 2.1)",&local_8c9);
  compile_fixture::run(&local_428,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_428,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb10,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 3.1 8)",&local_8c9);
  compile_fixture::run(&local_448,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_448,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb11,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 3.2 2.1)",&local_8c9)
  ;
  compile_fixture::run(&local_468,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_468,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb12,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 1 21)",&local_8c9);
  compile_fixture::run(&local_488,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb13,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 2 2.0)",&local_8c9);
  compile_fixture::run(&local_4a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb14,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 3.0 3)",&local_8c9);
  compile_fixture::run(&local_4c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb15,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 3.2 3.2)",&local_8c9)
  ;
  compile_fixture::run(&local_4e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb16,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(>= 1 1)",&local_8c9);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb17,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(= 12 13)",&local_8c9);
  compile_fixture::run(&local_528,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_528,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb19,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(= 12 12)",&local_8c9);
  compile_fixture::run(&local_548,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_548,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1a,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"(= 12.1 13.1)",&local_8c9);
  compile_fixture::run(&local_568,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_568,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"(= 12.1 12.1)",&local_8c9);
  compile_fixture::run(&local_588,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_588,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(= 12 13.1)",&local_8c9);
  compile_fixture::run(&local_5a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_5a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1d,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(= 12 12.0)",&local_8c9);
  compile_fixture::run(&local_5c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_5c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(= 12.0 13)",&local_8c9);
  compile_fixture::run(&local_5e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_5e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1f,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(= 12.0 12)",&local_8c9);
  compile_fixture::run(&local_608,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_608,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb20,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(!= 12 13)",&local_8c9);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb22,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(!= 12 12)",&local_8c9);
  compile_fixture::run(&local_648,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_648,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb23,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"(!= 12.1 13.1)",&local_8c9);
  compile_fixture::run(&local_668,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_668,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb24,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"(!= 12.1 12.1)",&local_8c9);
  compile_fixture::run(&local_688,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_688,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb25,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(!= 12 13.1)",&local_8c9)
  ;
  compile_fixture::run(&local_6a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_6a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb26,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(!= 12 12.0)",&local_8c9)
  ;
  compile_fixture::run(&local_6c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_6c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb27,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(!= 12.0 13)",&local_8c9)
  ;
  compile_fixture::run(&local_6e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_6e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb28,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(!= 12.0 12)",&local_8c9)
  ;
  compile_fixture::run(&local_708,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_708,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb29,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"(eq? \'foo \'bar) ",&local_8c9);
  compile_fixture::run(&local_728,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_728,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"(eq? \'foo \'foo) ",&local_8c9);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(+)",&local_8c9);
  compile_fixture::run(&local_768,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_768,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(*)",&local_8c9);
  compile_fixture::run(&local_788,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_788,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2f,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(-)",&local_8c9);
  compile_fixture::run(&local_7a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_7a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb30,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/)",&local_8c9);
  compile_fixture::run(&local_7c8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_7c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb31,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(+ 3)",&local_8c9);
  compile_fixture::run(&local_7e8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_7e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb32,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(- 3)",&local_8c9);
  compile_fixture::run(&local_808,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_808,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb33,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(* 5)",&local_8c9);
  compile_fixture::run(&local_828,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_828,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb34,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 1 5)",&local_8c9);
  compile_fixture::run(&local_848,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_848,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb35,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 1 5 2)",&local_8c9);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0.1",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb36,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 5)",&local_8c9);
  compile_fixture::run(&local_888,&this->super_compile_fixture,&local_8c8,true,iVar1);
  iVar1 = 0x1befe8;
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_888,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb37,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"(/ 5.0)",&local_8c9);
  compile_fixture::run(&local_8a8,&this->super_compile_fixture,&local_8c8,true,iVar1);
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_8a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb38,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      ops.primitives_inlined = true;
      TEST_EQ("5", run("(+ 3 2)"));
      TEST_EQ("5.2", run("(+ 3.2 2)"));
      TEST_EQ("5.5", run("(+ 3.2 2.3)"));
      TEST_EQ("5.1", run("(+ 3 2.1)"));

      TEST_EQ("1", run("(- 3 2)"));
      TEST_EQ("1.2", run("(- 3.2 2)"));
      TEST_EQ("0.9", run("(- 3.2 2.3)"));
      TEST_EQ("0.9", run("(- 3 2.1)"));

      TEST_EQ("6", run("(* 3 2)"));
      TEST_EQ("6.4", run("(* 3.2 2)"));
      TEST_EQ("6.9", run("(* 3.0 2.3)"));
      TEST_EQ("6.3", run("(* 3 2.1)"));

      TEST_EQ("4", run("(/ 8 2)"));
      TEST_EQ("1.6", run("(/ 3.2 2)"));
      TEST_EQ("1.5", run("(/ 3.0 2.0)"));
      TEST_EQ("1.5", run("(/ 3 2.0)"));

      TEST_EQ("#f", run("(< 3 2.1)"));
      TEST_EQ("#t", run("(< 3.1 8)"));
      TEST_EQ("#f", run("(< 3.2 2.1)"));
      TEST_EQ("#t", run("(< 1 21)"));

      TEST_EQ("#f", run("(<= 3 2.1)"));
      TEST_EQ("#t", run("(<= 3.1 8)"));
      TEST_EQ("#f", run("(<= 3.2 2.1)"));
      TEST_EQ("#t", run("(<= 1 21)"));
      TEST_EQ("#t", run("(<= 2 2.0)"));
      TEST_EQ("#t", run("(<= 3.0 3)"));
      TEST_EQ("#t", run("(<= 3.2 3.2)"));
      TEST_EQ("#t", run("(<= 1 1)"));

      TEST_EQ("#t", run("(> 3 2.1)"));
      TEST_EQ("#f", run("(> 3.1 8)"));
      TEST_EQ("#t", run("(> 3.2 2.1)"));
      TEST_EQ("#f", run("(> 1 21)"));

      TEST_EQ("#t", run("(>= 3 2.1)"));
      TEST_EQ("#f", run("(>= 3.1 8)"));
      TEST_EQ("#t", run("(>= 3.2 2.1)"));
      TEST_EQ("#f", run("(>= 1 21)"));
      TEST_EQ("#t", run("(>= 2 2.0)"));
      TEST_EQ("#t", run("(>= 3.0 3)"));
      TEST_EQ("#t", run("(>= 3.2 3.2)"));
      TEST_EQ("#t", run("(>= 1 1)"));

      TEST_EQ("#f", run("(= 12 13)"));
      TEST_EQ("#t", run("(= 12 12)"));
      TEST_EQ("#f", run("(= 12.1 13.1)"));
      TEST_EQ("#t", run("(= 12.1 12.1)"));
      TEST_EQ("#f", run("(= 12 13.1)"));
      TEST_EQ("#t", run("(= 12 12.0)"));
      TEST_EQ("#f", run("(= 12.0 13)"));
      TEST_EQ("#t", run("(= 12.0 12)"));

      TEST_EQ("#t", run("(!= 12 13)"));
      TEST_EQ("#f", run("(!= 12 12)"));
      TEST_EQ("#t", run("(!= 12.1 13.1)"));
      TEST_EQ("#f", run("(!= 12.1 12.1)"));
      TEST_EQ("#t", run("(!= 12 13.1)"));
      TEST_EQ("#f", run("(!= 12 12.0)"));
      TEST_EQ("#t", run("(!= 12.0 13)"));
      TEST_EQ("#f", run("(!= 12.0 12)"));

      TEST_EQ("#f", run("(eq? 'foo 'bar) "));
      TEST_EQ("#t", run("(eq? 'foo 'foo) "));

      TEST_EQ("0", run("(+)"));
      TEST_EQ("1", run("(*)"));
      TEST_EQ("0", run("(-)"));
      TEST_EQ("1", run("(/)"));
      TEST_EQ("3", run("(+ 3)"));
      TEST_EQ("-3", run("(- 3)"));
      TEST_EQ("5", run("(* 5)"));
      TEST_EQ("0.2", run("(/ 1 5)"));
      TEST_EQ("0.1", run("(/ 1 5 2)"));
      TEST_EQ("0.2", run("(/ 5)"));
      TEST_EQ("0.2", run("(/ 5.0)"));
      }